

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_complex_sub(sexp ctx,sexp a,sexp b)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  sexp psVar3;
  sexp tmp;
  sexp local_48;
  sexp_gc_var_t local_40;
  sexp_conflict local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_48;
  local_40.var = &local_30;
  local_30 = (sexp_conflict)0x43e;
  local_48 = (sexp)0x43e;
  local_28.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_48 = sexp_complex_copy(ctx,b);
  psVar3 = (local_48->value).type.name;
  if (((ulong)psVar3 & 3) == 0) {
    sVar1 = psVar3->tag;
    if (sVar1 == 0xb) {
      (psVar3->value).stack.length = (psVar3->value).stack.length ^ 0x8000000000000000;
    }
    else if (sVar1 == 0xc) {
      (psVar3->value).flonum_bits[0] = -(psVar3->value).flonum_bits[0];
    }
    else {
      if (sVar1 != 0xd) goto LAB_0011ccfd;
      psVar2 = (psVar3->value).type.name;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        (psVar3->value).type.name = (sexp)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
    }
  }
  else {
LAB_0011ccfd:
    if (((ulong)psVar3 & 1) != 0) {
      (local_48->value).type.name = (sexp)(1 - ((ulong)psVar3 & 0xfffffffffffffffe));
    }
  }
  psVar3 = (local_48->value).type.cpl;
  if (((ulong)psVar3 & 3) == 0) {
    sVar1 = psVar3->tag;
    if (sVar1 == 0xb) {
      (psVar3->value).stack.length = (psVar3->value).stack.length ^ 0x8000000000000000;
      goto LAB_0011cdd4;
    }
    if (sVar1 == 0xc) {
      (psVar3->value).flonum_bits[0] = -(psVar3->value).flonum_bits[0];
      goto LAB_0011cdd4;
    }
    if (sVar1 == 0xd) {
      psVar2 = (psVar3->value).type.name;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
      else if (((ulong)psVar2 & 1) != 0) {
        (psVar3->value).type.name = (sexp)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
      }
      goto LAB_0011cdd4;
    }
  }
  if (((ulong)psVar3 & 1) != 0) {
    (local_48->value).type.cpl = (sexp)(1 - ((ulong)psVar3 & 0xfffffffffffffffe));
  }
LAB_0011cdd4:
  psVar3 = sexp_complex_add(ctx,a,local_48);
  (ctx->value).context.saves = local_40.next;
  return psVar3;
}

Assistant:

sexp sexp_complex_sub (sexp ctx, sexp a, sexp b) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  tmp = sexp_complex_copy(ctx, b);
  sexp_negate_maybe_ratio(sexp_complex_real(tmp));
  sexp_negate_maybe_ratio(sexp_complex_imag(tmp));
  res = sexp_complex_add(ctx, a, tmp);
  sexp_gc_release2(ctx);
  return res;
}